

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactorUtils.cpp
# Opt level: O2

void __thiscall
HFactor::reportDoubleVector
          (HFactor *this,string *name,vector<double,_std::allocator<double>_> *entry)

{
  pointer pdVar1;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  
  pdVar1 = (entry->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar4 = (ulong)((long)(entry->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_finish - (long)pdVar1) >> 3;
  printf("%-12s: siz %4d; cap %4d: ",(name->_M_dataplus)._M_p,uVar4 & 0xffffffff,
         (ulong)((long)(entry->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_end_of_storage - (long)pdVar1) >> 3);
  uVar5 = uVar4 & 0xffffffff;
  if ((int)uVar4 < 1) {
    uVar5 = 0;
  }
  uVar2 = 0;
  iVar6 = 0;
  lVar3 = 0;
  while( true ) {
    if (uVar5 * 8 == lVar3) break;
    if ((lVar3 != 0) && ((uVar2 / 10) * 10 + iVar6 == 0)) {
      printf("\n                                  ");
    }
    printf("%11.4g ",
           *(undefined8 *)
            ((long)(entry->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start + lVar3));
    lVar3 = lVar3 + 8;
    iVar6 = iVar6 + -1;
    uVar2 = uVar2 + 1;
  }
  putchar(10);
  return;
}

Assistant:

void HFactor::reportDoubleVector(const std::string name,
                                 const vector<double> entry) const {
  const HighsInt num_en = entry.size();
  printf("%-12s: siz %4d; cap %4d: ", name.c_str(), (int)num_en,
         (int)entry.capacity());
  for (HighsInt iEn = 0; iEn < num_en; iEn++) {
    if (iEn > 0 && iEn % 10 == 0)
      printf("\n                                  ");
    printf("%11.4g ", entry[iEn]);
  }
  printf("\n");
}